

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t rndr_readfn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  int iVar1;
  uint64_t ret;
  uint64_t local_10;
  
  env->CF = 0;
  env->VF = 0;
  env->NF = 0;
  env->ZF = 1;
  iVar1 = qemu_guest_getrandom(&local_10,8);
  if (iVar1 < 0) {
    env->ZF = 0;
    local_10 = 0;
  }
  return local_10;
}

Assistant:

static uint64_t rndr_readfn(CPUARMState *env, const ARMCPRegInfo *ri)
{
    uint64_t ret;

    /* Success sets NZCV = 0000.  */
    env->NF = env->CF = env->VF = 0, env->ZF = 1;

    if (qemu_guest_getrandom(&ret, sizeof(ret)) < 0) {
        /*
         * ??? Failed, for unknown reasons in the crypto subsystem.
         * The best we can do is log the reason and return the
         * timed-out indication to the guest.  There is no reason
         * we know to expect this failure to be transitory, so the
         * guest may well hang retrying the operation.
         */
        //qemu_log_mask(LOG_UNIMP, "%s: Crypto failure: %s",
        //              ri->name, error_get_pretty(err));

        env->ZF = 0; /* NZCF = 0100 */
        return 0;
    }
    return ret;
}